

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ContainerPrinter::PrintValue<ST::string,void>(string *container,ostream *os)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  
  std::operator<<(os,'{');
  pcVar1 = (container->m_buffer).m_chars;
  sVar2 = (container->m_buffer).m_size;
  sVar3 = 0;
  do {
    if (sVar2 == sVar3) {
      if (sVar2 != 0) {
LAB_00188146:
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    if ((sVar3 != 0) && (std::operator<<(os,','), sVar3 == 0x20)) {
      std::operator<<(os," ...");
      goto LAB_00188146;
    }
    std::operator<<(os,' ');
    UniversalPrinter<char>::Print(pcVar1 + sVar3,os);
    sVar3 = sVar3 + 1;
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }